

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

void uv__run_pending(uv_loop_t *loop)

{
  int iVar1;
  uv__io_t *w;
  uv__queue pq;
  uv__queue *q;
  uv_loop_t *loop_local;
  
  uv__queue_move(&loop->pending_queue,(uv__queue *)&w);
  while( true ) {
    iVar1 = uv__queue_empty((uv__queue *)&w);
    if (iVar1 != 0) break;
    pq.prev = uv__queue_head((uv__queue *)&w);
    uv__queue_remove(pq.prev);
    uv__queue_init(pq.prev);
    (*(code *)pq.prev[-1].prev)(loop,&pq.prev[-1].prev,4);
  }
  return;
}

Assistant:

static void uv__run_pending(uv_loop_t* loop) {
  struct uv__queue* q;
  struct uv__queue pq;
  uv__io_t* w;

  uv__queue_move(&loop->pending_queue, &pq);

  while (!uv__queue_empty(&pq)) {
    q = uv__queue_head(&pq);
    uv__queue_remove(q);
    uv__queue_init(q);
    w = uv__queue_data(q, uv__io_t, pending_queue);
    w->cb(loop, w, POLLOUT);
  }
}